

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aggregate_executor.hpp
# Opt level: O2

void duckdb::AggregateExecutor::
     UnaryScatterLoop<duckdb::FirstState<unsigned_int>,unsigned_int,duckdb::FirstFunction<true,false>>
               (uint *idata,AggregateInputData *aggr_input_data,FirstState<unsigned_int> **states,
               SelectionVector *isel,SelectionVector *ssel,ValidityMask *mask,idx_t count)

{
  ulong uVar1;
  idx_t i;
  ulong uVar2;
  AggregateUnaryInput local_48;
  
  local_48.input = aggr_input_data;
  local_48.input_mask = mask;
  for (uVar2 = 0; count != uVar2; uVar2 = uVar2 + 1) {
    local_48.input_idx = uVar2;
    if (isel->sel_vector != (sel_t *)0x0) {
      local_48.input_idx = (idx_t)isel->sel_vector[uVar2];
    }
    uVar1 = uVar2;
    if (ssel->sel_vector != (sel_t *)0x0) {
      uVar1 = (ulong)ssel->sel_vector[uVar2];
    }
    FirstFunction<true,false>::
    Operation<unsigned_int,duckdb::FirstState<unsigned_int>,duckdb::FirstFunction<true,false>>
              (states[uVar1],idata + local_48.input_idx,&local_48);
  }
  return;
}

Assistant:

static inline void UnaryScatterLoop(const INPUT_TYPE *__restrict idata, AggregateInputData &aggr_input_data,
	                                    STATE_TYPE **__restrict states, const SelectionVector &isel,
	                                    const SelectionVector &ssel, ValidityMask &mask, idx_t count) {
		if (OP::IgnoreNull() && !mask.AllValid()) {
			// potential NULL values and NULL values are ignored
			AggregateUnaryInput input(aggr_input_data, mask);
			for (idx_t i = 0; i < count; i++) {
				input.input_idx = isel.get_index(i);
				auto sidx = ssel.get_index(i);
				if (mask.RowIsValid(input.input_idx)) {
					OP::template Operation<INPUT_TYPE, STATE_TYPE, OP>(*states[sidx], idata[input.input_idx], input);
				}
			}
		} else {
			// quick path: no NULL values or NULL values are not ignored
			AggregateUnaryInput input(aggr_input_data, mask);
			for (idx_t i = 0; i < count; i++) {
				input.input_idx = isel.get_index(i);
				auto sidx = ssel.get_index(i);
				OP::template Operation<INPUT_TYPE, STATE_TYPE, OP>(*states[sidx], idata[input.input_idx], input);
			}
		}
	}